

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  iterator iVar2;
  bool bVar3;
  pair<int,_int> pVar4;
  FILE *__stream;
  ulong uVar5;
  int i;
  int index;
  char *pcVar6;
  pair<int,_int> *set;
  SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_> *set_00;
  bool bVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  TypeParam ht_in;
  TypeParam ht_out;
  TransparentHasher local_200;
  undefined1 local_1f0 [8];
  undefined8 *local_1e8;
  pair<int,_int> local_1e0;
  SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_> local_1d1;
  iterator local_1d0;
  undefined1 *local_188;
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  nonempty_iterator local_160;
  float local_158;
  float local_154;
  undefined1 local_150;
  undefined8 local_130;
  sparsetable<std::pair<int,int>,(unsigned_short)48,Alloc<std::pair<int,int>,unsigned_long,18446744073709551615ul>>
  local_128 [56];
  ulong local_f0;
  undefined **local_d8;
  undefined1 local_d0 [160];
  
  local_1d0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)0x0;
  local_1d0.pos.row_begin._M_current = local_1d0.pos.row_begin._M_current & 0xffffffff00000000;
  local_1f0 = (undefined1  [8])0x0;
  local_1e8 = (undefined8 *)((ulong)local_1e8 & 0xffffffff00000000);
  local_180._0_8_ = local_180._0_8_ & 0xffffffff00000000;
  local_180._8_8_ =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_d8 = &PTR__BaseHashtableInterface_00c26e78;
  set = &local_1e0;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_d0,0,(TransparentHasher *)&local_1d0,(TransparentHasher *)local_1f0,
                     (PairNegation<std::pair<int,_int>_> *)&local_200,
                     (SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_> *)set,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_180);
  local_d8 = &PTR__BaseHashtableInterface_00c26df8;
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(2000);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_d0);
  local_d0._60_4_ = -pVar4.first;
  local_d0[0x2a] = true;
  local_d0._64_4_ = (undefined4)(-((ulong)pVar4 & 0xffffffff00000000) >> 0x20);
  index = 1;
  do {
    local_1d0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)UniqueObjectHelper<std::pair<int,int>>(index);
    google::
    sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_d0,1);
    google::
    sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_180,
                      (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)local_d0,(const_reference)&local_1d0);
    index = index + 1;
  } while (index != 100);
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(0x38);
  local_180._0_8_ = (ulong)(uint)-pVar4.first - ((ulong)pVar4 & 0xffffffff00000000);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_d0,(key_type *)local_180);
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(0x16);
  local_180._0_8_ = (ulong)(uint)-pVar4.first - ((ulong)pVar4 & 0xffffffff00000000);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_d0,(key_type *)local_180);
  __stream = tmpfile();
  bVar7 = __stream != (FILE *)0x0;
  local_1d0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1d0.ht._1_7_,bVar7);
  local_1d0.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_180,(internal *)&local_1d0,(AssertionResult *)"fp != __null","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b8,(char *)local_180._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if ((undefined1 *)local_180._0_8_ != local_170) {
      operator_delete((void *)local_180._0_8_);
    }
    if (local_1f0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f0 + 8))();
    }
  }
  iVar2._M_current = local_1d0.pos.row_begin._M_current;
  if (local_1d0.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_1d0.pos.row_begin._M_current)->group !=
        (pointer)&((local_1d0.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_1d0.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_d0);
  bVar3 = google::
          sparsetable<std::pair<int,int>,(unsigned_short)48,Alloc<std::pair<int,int>,unsigned_long,18446744073709551615ul>>
          ::serialize<ValueSerializer,_IO_FILE>
                    ((sparsetable<std::pair<int,int>,(unsigned_short)48,Alloc<std::pair<int,int>,unsigned_long,18446744073709551615ul>>
                      *)(local_d0 + 0x50));
  local_1d0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1d0.ht._1_7_,bVar3);
  local_1d0.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_180,(internal *)&local_1d0,
               (AssertionResult *)"ht_out.serialize(ValueSerializer(), fp)","false","true",
               (char *)set);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b9,(char *)local_180._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if ((undefined1 *)local_180._0_8_ != local_170) {
      operator_delete((void *)local_180._0_8_);
    }
    if (local_1f0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1f0 + 8))();
    }
  }
  iVar2._M_current = local_1d0.pos.row_begin._M_current;
  if (local_1d0.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_1d0.pos.row_begin._M_current)->group !=
        (pointer)&((local_1d0.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_1d0.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  rewind(__stream);
  local_1f0 = (undefined1  [8])0x0;
  local_1e8 = (undefined8 *)((ulong)local_1e8 & 0xffffffff00000000);
  local_200.super_Hasher.id_ = 0;
  local_200.super_Hasher.num_hashes_ = 0;
  local_200.super_Hasher.num_compares_ = 0;
  local_1d0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)local_1d0.ht & 0xffffffff00000000);
  local_1d0.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  this_00 = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_180 + 8);
  local_180._0_8_ = &PTR__BaseHashtableInterface_00c26e78;
  set_00 = &local_1d1;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_00,0,(TransparentHasher *)local_1f0,&local_200,
                     (PairNegation<std::pair<int,_int>_> *)&local_1e0,set_00,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_1d0);
  local_180._0_8_ = &PTR__BaseHashtableInterface_00c26df8;
  local_1f0[0] = (internal)bVar7;
  local_1e8 = (undefined8 *)0x0;
  if (__stream == (FILE *)0x0) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1d0,(internal *)local_1f0,(AssertionResult *)"fp != __null","false",
               "true",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4bd,(char *)local_1d0.ht);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1d0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1d0.pos.row_end) {
      operator_delete(local_1d0.ht);
    }
    if ((pair<int,_int>)local_200.super_Hasher._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_200.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_1e8;
  if (local_1e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1e8 != local_1e8 + 2) {
      operator_delete((undefined8 *)*local_1e8);
    }
    operator_delete(puVar1);
  }
  local_130 = 0;
  bVar7 = google::
          sparsetable<std::pair<int,int>,(unsigned_short)48,Alloc<std::pair<int,int>,unsigned_long,18446744073709551615ul>>
          ::unserialize<ValueSerializer,_IO_FILE>(local_128,__stream);
  local_158 = local_158 * (float)local_f0;
  uVar5 = (ulong)local_158;
  local_170._8_8_ = (long)(local_158 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  local_154 = (float)local_f0 * local_154;
  uVar5 = (ulong)local_154;
  local_160 = (nonempty_iterator)((long)(local_154 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5);
  local_150 = 0;
  local_1f0[0] = (internal)bVar7;
  local_1e8 = (undefined8 *)0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1d0,(internal *)local_1f0,
               (AssertionResult *)"ht_in.unserialize(ValueSerializer(), fp)","false","true",
               (char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4be,(char *)local_1d0.ht);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1d0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1d0.pos.row_end) {
      operator_delete(local_1d0.ht);
    }
    if ((pair<int,_int>)local_200.super_Hasher._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_200.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_1e8;
  if (local_1e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1e8 != local_1e8 + 2) {
      operator_delete((undefined8 *)*local_1e8);
    }
    operator_delete(puVar1);
  }
  fclose(__stream);
  local_200.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int,int>>(1);
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(1);
  local_1e0 = (pair<int,_int>)((ulong)(uint)-pVar4.first - ((ulong)pVar4 & 0xffffffff00000000));
  google::
  sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::find<std::pair<int,int>>
            (&local_1d0,
             (sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,&local_1e0);
  local_188 = local_180;
  testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
            ((internal *)local_1f0,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (pair<int,_int> *)&local_200,local_1d0.pos.col_current);
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1e8 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_1e8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if (local_1d0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1d0.ht)->settings).
                             super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                  + 8))();
    }
  }
  puVar1 = local_1e8;
  if (local_1e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1e8 != local_1e8 + 2) {
      operator_delete((undefined8 *)*local_1e8);
    }
    operator_delete(puVar1);
  }
  local_200.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int,int>>(99);
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(99);
  local_1e0 = (pair<int,_int>)((ulong)(uint)-pVar4.first - ((ulong)pVar4 & 0xffffffff00000000));
  google::
  sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::find<std::pair<int,int>>
            (&local_1d0,
             (sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,&local_1e0);
  local_188 = local_180;
  testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
            ((internal *)local_1f0,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (pair<int,_int> *)&local_200,local_1d0.pos.col_current);
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1e8 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_1e8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if (local_1d0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1d0.ht)->settings).
                             super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                  + 8))();
    }
  }
  puVar1 = local_1e8;
  if (local_1e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1e8 != local_1e8 + 2) {
      operator_delete((undefined8 *)*local_1e8);
    }
    operator_delete(puVar1);
  }
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(100);
  local_1d0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)(uint)-pVar4.first - ((ulong)pVar4 & 0xffffffff00000000));
  pVar8 = google::
          sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,(pair<int,_int> *)&local_1d0);
  bVar7 = pVar8.first == 0xffffffffffffffff;
  local_1f0[0] = (internal)bVar7;
  local_1e8 = (undefined8 *)0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1d0,(internal *)local_1f0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",(char *)set_00)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c3,(char *)local_1d0.ht);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1d0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1d0.pos.row_end) {
      operator_delete(local_1d0.ht);
    }
    if ((pair<int,_int>)local_200.super_Hasher._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_200.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_1e8;
  if (local_1e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1e8 != local_1e8 + 2) {
      operator_delete((undefined8 *)*local_1e8);
    }
    operator_delete(puVar1);
  }
  local_200.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int,int>>(0x15);
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(0x15);
  local_1e0 = (pair<int,_int>)((ulong)(uint)-pVar4.first - ((ulong)pVar4 & 0xffffffff00000000));
  google::
  sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::find<std::pair<int,int>>
            (&local_1d0,
             (sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,&local_1e0);
  local_188 = local_180;
  testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
            ((internal *)local_1f0,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (pair<int,_int> *)&local_200,local_1d0.pos.col_current);
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1e8 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_1e8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c4,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if (local_1d0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1d0.ht)->settings).
                             super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                  + 8))();
    }
  }
  puVar1 = local_1e8;
  if (local_1e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1e8 != local_1e8 + 2) {
      operator_delete((undefined8 *)*local_1e8);
    }
    operator_delete(puVar1);
  }
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(0x16);
  local_1d0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)(uint)-pVar4.first - ((ulong)pVar4 & 0xffffffff00000000));
  pVar8 = google::
          sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,(pair<int,_int> *)&local_1d0);
  bVar7 = pVar8.first == 0xffffffffffffffff;
  local_1f0[0] = (internal)bVar7;
  local_1e8 = (undefined8 *)0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1d0,(internal *)local_1f0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c6,(char *)local_1d0.ht);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1d0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1d0.pos.row_end) {
      operator_delete(local_1d0.ht);
    }
    if ((pair<int,_int>)local_200.super_Hasher._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_200.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_1e8;
  if (local_1e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1e8 != local_1e8 + 2) {
      operator_delete((undefined8 *)*local_1e8);
    }
    operator_delete(puVar1);
  }
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(0x38);
  local_1d0.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)(uint)-pVar4.first - ((ulong)pVar4 & 0xffffffff00000000));
  pVar8 = google::
          sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,(pair<int,_int> *)&local_1d0);
  bVar7 = pVar8.first == 0xffffffffffffffff;
  local_1f0[0] = (internal)bVar7;
  local_1e8 = (undefined8 *)0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1d0,(internal *)local_1f0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c7,(char *)local_1d0.ht);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1d0.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1d0.pos.row_end) {
      operator_delete(local_1d0.ht);
    }
    if ((pair<int,_int>)local_200.super_Hasher._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_200.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_1e8;
  if (local_1e8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1e8 != local_1e8 + 2) {
      operator_delete((undefined8 *)*local_1e8);
    }
    operator_delete(puVar1);
  }
  local_180._0_8_ = &PTR__BaseHashtableInterface_00c26e78;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)local_128);
  local_d8 = &PTR__BaseHashtableInterface_00c26e78;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)(local_d0 + 0x50));
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}